

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGParseImportRef(void *payload,void *data,xmlChar *name)

{
  int iVar1;
  void *pvVar2;
  char *msg;
  xmlChar *str1;
  
  *(byte *)((long)payload + 99) = *(byte *)((long)payload + 99) | 1;
  iVar1 = xmlHashAddEntry(*(xmlHashTablePtr *)(*(long *)((long)data + 0x30) + 0x38),name,payload);
  if (iVar1 < 0) {
    pvVar2 = xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)data + 0x30) + 0x38),
                           *(xmlChar **)((long)payload + 0x10));
    if (pvVar2 == (void *)0x0) {
      str1 = *(xmlChar **)((long)payload + 0x10);
      if (str1 == (xmlChar *)0x0) {
        msg = "Error refs definitions\n";
        str1 = (xmlChar *)0x0;
      }
      else {
        msg = "Error refs definitions \'%s\'\n";
      }
      xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,(xmlNodePtr)0x0,0x44a,msg,str1,(xmlChar *)0x0);
      return;
    }
    *(undefined8 *)((long)payload + 0x58) = *(undefined8 *)((long)pvVar2 + 0x58);
    *(void **)((long)pvVar2 + 0x58) = payload;
  }
  return;
}

Assistant:

static void
xmlRelaxNGParseImportRef(void *payload, void *data, const xmlChar *name) {
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGDefinePtr def = (xmlRelaxNGDefinePtr) payload;
    int tmp;

    def->dflags |= IS_EXTERNAL_REF;

    tmp = xmlHashAddEntry(ctxt->grammar->refs, name, def);
    if (tmp < 0) {
        xmlRelaxNGDefinePtr prev;

        prev = (xmlRelaxNGDefinePtr)
            xmlHashLookup(ctxt->grammar->refs, def->name);
        if (prev == NULL) {
            if (def->name != NULL) {
                xmlRngPErr(ctxt, NULL, XML_RNGP_REF_CREATE_FAILED,
                           "Error refs definitions '%s'\n",
                           def->name, NULL);
            } else {
                xmlRngPErr(ctxt, NULL, XML_RNGP_REF_CREATE_FAILED,
                           "Error refs definitions\n",
                           NULL, NULL);
            }
        } else {
            def->nextHash = prev->nextHash;
            prev->nextHash = def;
        }
    }
}